

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv_fs_opendir(uv_loop_t *loop,uv_fs_t *req,char *path,uv_fs_cb cb)

{
  int iVar1;
  char *pcVar2;
  
  if (req == (uv_fs_t *)0x0) {
    iVar1 = -0x16;
  }
  else {
    req->type = UV_FS;
    req->fs_type = UV_FS_OPENDIR;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    if (path == (char *)0x0) {
      __assert_fail("path != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/fs.c"
                    ,0x7e4,"int uv_fs_opendir(uv_loop_t *, uv_fs_t *, const char *, uv_fs_cb)");
    }
    if (cb == (uv_fs_cb)0x0) {
      req->path = path;
      uv__fs_work(&req->work_req);
      iVar1 = (int)req->result;
    }
    else {
      pcVar2 = uv__strdup(path);
      req->path = pcVar2;
      if (pcVar2 == (char *)0x0) {
        iVar1 = -0xc;
      }
      else {
        (loop->active_reqs).count = (loop->active_reqs).count + 1;
        uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int uv_fs_opendir(uv_loop_t* loop,
                  uv_fs_t* req,
                  const char* path,
                  uv_fs_cb cb) {
  INIT(OPENDIR);
  PATH;
  POST;
}